

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O0

void google::protobuf::util::anon_unknown_1::ConvertOptionField
               (Reflection *reflection,Message *options,FieldDescriptor *field,int index,Option *out
               )

{
  Any *pAVar1;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  uint uVar5;
  Arena *arena;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 value_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int value_01;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int value_02;
  long extraout_RDX;
  long extraout_RDX_00;
  long value_03;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long value_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_06;
  FieldDescriptor *pFVar6;
  EnumValueDescriptor *local_2e0;
  bool local_2b9;
  uint local_2a4;
  uint local_28c;
  _anonymous_namespace_ *local_278;
  _anonymous_namespace_ *local_260;
  float local_244;
  double local_230;
  Message *local_220;
  Reflection *local_1f8;
  Int32Value local_1e8;
  EnumValueDescriptor *local_1d0;
  EnumValueDescriptor *val_1;
  BytesValue local_1a8;
  string local_188 [32];
  StringValue local_168;
  string local_148;
  string *local_128;
  string *val;
  UInt32Value local_108;
  Int32Value local_f0;
  UInt64Value local_d8;
  Int64Value local_b8;
  FloatValue local_98;
  DoubleValue local_70;
  Any *local_50;
  Any *value;
  Option *out_local;
  FieldDescriptor *pFStack_38;
  int index_local;
  FieldDescriptor *field_local;
  Message *options_local;
  Reflection *reflection_local;
  Option *local_18;
  anon_union_24_1_493b367e_for_Option_4 *local_10;
  
  value = (Any *)out;
  out_local._4_4_ = index;
  pFStack_38 = field;
  field_local = (FieldDescriptor *)options;
  options_local = (Message *)reflection;
  bVar2 = FieldDescriptor::is_extension(field);
  if (bVar2) {
    local_1f8 = (Reflection *)FieldDescriptor::full_name_abi_cxx11_(pFStack_38);
  }
  else {
    local_1f8 = (Reflection *)FieldDescriptor::name_abi_cxx11_(pFStack_38);
  }
  reflection_local = local_1f8;
  local_10 = &out->field_0;
  local_18 = out;
  arena = MessageLite::GetArena((MessageLite *)out);
  internal::ArenaStringPtr::Set<>(&(out->field_0)._impl_.name_,(string *)local_1f8,arena);
  local_50 = Option::mutable_value((Option *)value);
  CVar3 = FieldDescriptor::cpp_type(pFStack_38);
  pAVar1 = local_50;
  switch(CVar3) {
  case CPPTYPE_INT32:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_28c = Reflection::GetRepeatedInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
      value_01 = extraout_EDX;
    }
    else {
      local_28c = Reflection::GetInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
      value_01 = extraout_EDX_00;
    }
    (anonymous_namespace)::WrapValue<google::protobuf::Int32Value,int>
              (&local_f0,(_anonymous_namespace_ *)(ulong)local_28c,value_01);
    Any::PackFrom(pAVar1,&local_f0.super_Message);
    Int32Value::~Int32Value(&local_f0);
    break;
  case CPPTYPE_INT64:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_260 = (_anonymous_namespace_ *)
                  Reflection::GetRepeatedInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
      value_03 = extraout_RDX;
    }
    else {
      local_260 = (_anonymous_namespace_ *)
                  Reflection::GetInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
      value_03 = extraout_RDX_00;
    }
    (anonymous_namespace)::WrapValue<google::protobuf::Int64Value,long>
              (&local_b8,local_260,value_03);
    Any::PackFrom(pAVar1,&local_b8.super_Message);
    Int64Value::~Int64Value(&local_b8);
    break;
  case CPPTYPE_UINT32:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_2a4 = Reflection::GetRepeatedUInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
      uVar5 = extraout_EDX_01;
    }
    else {
      local_2a4 = Reflection::GetUInt32
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
      uVar5 = extraout_EDX_02;
    }
    (anonymous_namespace)::WrapValue<google::protobuf::UInt32Value,unsigned_int>
              (&local_108,(_anonymous_namespace_ *)(ulong)local_2a4,uVar5);
    Any::PackFrom(pAVar1,&local_108.super_Message);
    UInt32Value::~UInt32Value(&local_108);
    break;
  case CPPTYPE_UINT64:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_278 = (_anonymous_namespace_ *)
                  Reflection::GetRepeatedUInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
      value_04 = extraout_RDX_01;
    }
    else {
      local_278 = (_anonymous_namespace_ *)
                  Reflection::GetUInt64
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
      value_04 = extraout_RDX_02;
    }
    (anonymous_namespace)::WrapValue<google::protobuf::UInt64Value,unsigned_long>
              (&local_d8,local_278,value_04);
    Any::PackFrom(pAVar1,&local_d8.super_Message);
    UInt64Value::~UInt64Value(&local_d8);
    break;
  case CPPTYPE_DOUBLE:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    pFVar6 = field_local;
    if (bVar2) {
      local_230 = Reflection::GetRepeatedDouble
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
    }
    else {
      local_230 = Reflection::GetDouble
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
    }
    (anonymous_namespace)::WrapValue<google::protobuf::DoubleValue,double>
              (&local_70,(_anonymous_namespace_ *)pFVar6,local_230);
    Any::PackFrom(pAVar1,&local_70.super_Message);
    DoubleValue::~DoubleValue(&local_70);
    break;
  case CPPTYPE_FLOAT:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    pFVar6 = field_local;
    if (bVar2) {
      local_244 = Reflection::GetRepeatedFloat
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
    }
    else {
      local_244 = Reflection::GetFloat
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38);
    }
    (anonymous_namespace)::WrapValue<google::protobuf::FloatValue,float>
              (&local_98,(_anonymous_namespace_ *)pFVar6,local_244);
    Any::PackFrom(pAVar1,&local_98.super_Message);
    FloatValue::~FloatValue(&local_98);
    break;
  case CPPTYPE_BOOL:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_2b9 = Reflection::GetRepeatedBool
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
      value_00 = extraout_DL;
    }
    else {
      local_2b9 = Reflection::GetBool((Reflection *)options_local,(Message *)field_local,pFStack_38)
      ;
      value_00 = extraout_DL_00;
    }
    (anonymous_namespace)::WrapValue<google::protobuf::BoolValue,bool>
              ((BoolValue *)&val,(_anonymous_namespace_ *)(ulong)local_2b9,(bool)value_00);
    Any::PackFrom(pAVar1,(Message *)&val);
    BoolValue::~BoolValue((BoolValue *)&val);
    break;
  case CPPTYPE_ENUM:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_2e0 = Reflection::GetRepeatedEnum
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
    }
    else {
      local_2e0 = Reflection::GetEnum((Reflection *)options_local,(Message *)field_local,pFStack_38)
      ;
    }
    pAVar1 = local_50;
    local_1d0 = local_2e0;
    uVar5 = EnumValueDescriptor::number(local_2e0);
    (anonymous_namespace)::WrapValue<google::protobuf::Int32Value,int>
              (&local_1e8,(_anonymous_namespace_ *)(ulong)uVar5,value_02);
    Any::PackFrom(pAVar1,&local_1e8.super_Message);
    Int32Value::~Int32Value(&local_1e8);
    break;
  case CPPTYPE_STRING:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      Reflection::GetRepeatedString_abi_cxx11_
                (&local_148,(Reflection *)options_local,(Message *)field_local,pFStack_38,
                 out_local._4_4_);
    }
    else {
      Reflection::GetString_abi_cxx11_
                (&local_148,(Reflection *)options_local,(Message *)field_local,pFStack_38);
    }
    local_128 = &local_148;
    TVar4 = FieldDescriptor::type(pFStack_38);
    pAVar1 = local_50;
    if (TVar4 == TYPE_STRING) {
      std::__cxx11::string::string(local_188,(string *)local_128);
      (anonymous_namespace)::WrapValue<google::protobuf::StringValue,std::__cxx11::string>
                (&local_168,(_anonymous_namespace_ *)local_188,value_05);
      Any::PackFrom(pAVar1,&local_168.super_Message);
      StringValue::~StringValue(&local_168);
      std::__cxx11::string::~string(local_188);
    }
    else {
      std::__cxx11::string::string((string *)&val_1,(string *)local_128);
      (anonymous_namespace)::WrapValue<google::protobuf::BytesValue,std::__cxx11::string>
                (&local_1a8,(_anonymous_namespace_ *)&val_1,value_06);
      Any::PackFrom(pAVar1,&local_1a8.super_Message);
      BytesValue::~BytesValue(&local_1a8);
      std::__cxx11::string::~string((string *)&val_1);
    }
    std::__cxx11::string::~string((string *)&local_148);
    break;
  case CPPTYPE_MESSAGE:
    bVar2 = FieldDescriptor::is_repeated(pFStack_38);
    if (bVar2) {
      local_220 = Reflection::GetRepeatedMessage
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             out_local._4_4_);
    }
    else {
      local_220 = Reflection::GetMessage
                            ((Reflection *)options_local,(Message *)field_local,pFStack_38,
                             (MessageFactory *)0x0);
    }
    Any::PackFrom(pAVar1,local_220);
  }
  return;
}

Assistant:

void ConvertOptionField(const Reflection* reflection, const Message& options,
                        const FieldDescriptor* field, int index, Option* out) {
  out->set_name(field->is_extension() ? field->full_name() : field->name());
  Any* value = out->mutable_value();
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_MESSAGE:
      value->PackFrom(
          field->is_repeated()
              ? reflection->GetRepeatedMessage(options, field, index)
              : reflection->GetMessage(options, field));
      return;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      value->PackFrom(WrapValue<DoubleValue>(
          field->is_repeated()
              ? reflection->GetRepeatedDouble(options, field, index)
              : reflection->GetDouble(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      value->PackFrom(WrapValue<FloatValue>(
          field->is_repeated()
              ? reflection->GetRepeatedFloat(options, field, index)
              : reflection->GetFloat(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      value->PackFrom(WrapValue<Int64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt64(options, field, index)
              : reflection->GetInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      value->PackFrom(WrapValue<UInt64Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt64(options, field, index)
              : reflection->GetUInt64(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      value->PackFrom(WrapValue<Int32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedInt32(options, field, index)
              : reflection->GetInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      value->PackFrom(WrapValue<UInt32Value>(
          field->is_repeated()
              ? reflection->GetRepeatedUInt32(options, field, index)
              : reflection->GetUInt32(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      value->PackFrom(WrapValue<BoolValue>(
          field->is_repeated()
              ? reflection->GetRepeatedBool(options, field, index)
              : reflection->GetBool(options, field)));
      return;
    case FieldDescriptor::CPPTYPE_STRING: {
      const std::string& val =
          field->is_repeated()
              ? reflection->GetRepeatedString(options, field, index)
              : reflection->GetString(options, field);
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        value->PackFrom(WrapValue<StringValue>(val));
      } else {
        value->PackFrom(WrapValue<BytesValue>(val));
      }
      return;
    }
    case FieldDescriptor::CPPTYPE_ENUM: {
      const EnumValueDescriptor* val =
          field->is_repeated()
              ? reflection->GetRepeatedEnum(options, field, index)
              : reflection->GetEnum(options, field);
      value->PackFrom(WrapValue<Int32Value>(val->number()));
      return;
    }
  }
}